

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam_parser_test.cpp
# Opt level: O2

void __thiscall bioparser::test::BioparserSamTest::Check(BioparserSamTest *this)

{
  char *pcVar1;
  AssertHelper local_38;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_30;
  AssertionResult gtest_ar;
  
  local_38.data_._0_4_ = 0x30;
  local_30._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)(this->o).
              super__Vector_base<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(this->o).
              super__Vector_base<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start >> 3);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)&gtest_ar,"48","o.size()",(int *)&local_38,(unsigned_long *)&local_30);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_30);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/rvaser[P]bioparser/test/sam_parser_test.cpp"
               ,0x3f,pcVar1);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (local_30._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_30._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  local_30._M_head_impl._0_4_ = 0xc2265;
  local_38.data_._0_4_ =
       std::
       accumulate<__gnu_cxx::__normal_iterator<std::unique_ptr<bioparser::test::SamOverlap,std::default_delete<bioparser::test::SamOverlap>>*,std::vector<std::unique_ptr<bioparser::test::SamOverlap,std::default_delete<bioparser::test::SamOverlap>>,std::allocator<std::unique_ptr<bioparser::test::SamOverlap,std::default_delete<bioparser::test::SamOverlap>>>>>,int,bioparser::test::BioparserSamTest::Check()::_lambda(unsigned_int,std::unique_ptr<bioparser::test::SamOverlap,std::default_delete<bioparser::test::SamOverlap>>const&)_1_>
                 ((this->o).
                  super__Vector_base<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start,
                  (this->o).
                  super__Vector_base<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish,0);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"795237",
             "std::accumulate(o.begin(), o.end(), 0, [] (std::uint32_t s, const std::unique_ptr<SamOverlap>& it) { return s + it->q_name.size() + it->t_name.size() + it->alignment.size() + it->t_next_name.size() + it->data.size() + it->quality.size(); })"
             ,(int *)&local_30,(int *)&local_38);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_30);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/rvaser[P]bioparser/test/sam_parser_test.cpp"
               ,0x49,pcVar1);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (local_30._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_30._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  local_30._M_head_impl._0_4_ = 0x9c2bd;
  local_38.data_._0_4_ =
       std::
       accumulate<__gnu_cxx::__normal_iterator<std::unique_ptr<bioparser::test::SamOverlap,std::default_delete<bioparser::test::SamOverlap>>*,std::vector<std::unique_ptr<bioparser::test::SamOverlap,std::default_delete<bioparser::test::SamOverlap>>,std::allocator<std::unique_ptr<bioparser::test::SamOverlap,std::default_delete<bioparser::test::SamOverlap>>>>>,int,bioparser::test::BioparserSamTest::Check()::_lambda(unsigned_int,std::unique_ptr<bioparser::test::SamOverlap,std::default_delete<bioparser::test::SamOverlap>>const&)_2_>
                 ((this->o).
                  super__Vector_base<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start,
                  (this->o).
                  super__Vector_base<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish,0);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"639677",
             "std::accumulate(o.begin(), o.end(), 0, [] (std::uint32_t s, const std::unique_ptr<SamOverlap>& it) { return s + it->flag + it->rhs_begin + it->map_quality + it->t_next_begin + it->template_len; })"
             ,(int *)&local_30,(int *)&local_38);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_30);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/rvaser[P]bioparser/test/sam_parser_test.cpp"
               ,0x52,pcVar1);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (local_30._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_30._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  return;
}

Assistant:

void Check() {
    EXPECT_EQ(48, o.size());
    EXPECT_EQ(795237, std::accumulate(o.begin(), o.end(), 0,
        [] (std::uint32_t s, const std::unique_ptr<SamOverlap>& it) {
          return s +
              it->q_name.size() +
              it->t_name.size() +
              it->alignment.size() +
              it->t_next_name.size() +
              it->data.size() +
              it->quality.size();
        }));
    EXPECT_EQ(639677, std::accumulate(o.begin(), o.end(), 0,
        [] (std::uint32_t s, const std::unique_ptr<SamOverlap>& it) {
          return s +
              it->flag +
              it->rhs_begin +
              it->map_quality +
              it->t_next_begin +
              it->template_len;
        }));
  }